

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

string * cli::Parser::stringify<unsigned_long>(string *__return_storage_ptr__,unsigned_long *value)

{
  std::__cxx11::to_string(__return_storage_ptr__,*value);
  return __return_storage_ptr__;
}

Assistant:

static std::string stringify(const T& value) {
			return std::to_string(value);
		}